

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O2

ZSTD_CDict *
ZSTD_createCDict_advanced2
          (void *dict,size_t dictSize,ZSTD_dictLoadMethod_e dictLoadMethod,
          ZSTD_dictContentType_e dictContentType,ZSTD_CCtx_params *originalCctxParams,
          ZSTD_customMem customMem)

{
  ZSTD_CCtx_params params;
  ZSTD_cwksp *pZVar1;
  void *start;
  size_t sVar2;
  long lVar3;
  ZSTD_CCtx_params *pZVar4;
  undefined8 *puVar5;
  U32 enableDedicatedDictSearch;
  ZSTD_CDict *cdict;
  ZSTD_useRowMatchFinderMode_e useRowMatchFinder;
  byte bVar6;
  ZSTD_allocFunction in_stack_fffffffffffffde8;
  ZSTD_allocFunction p_Var7;
  ZSTD_freeFunction in_stack_fffffffffffffdf0;
  ZSTD_freeFunction p_Var8;
  void *in_stack_fffffffffffffdf8;
  void *pvVar9;
  undefined1 auVar10 [12];
  undefined1 auVar11 [24];
  undefined1 in_stack_fffffffffffffe00 [152];
  undefined1 auVar12 [24];
  ZSTD_compressionParameters cParams;
  ZSTD_CCtx_params cctxParams;
  ZSTD_cwksp local_70;
  
  bVar6 = 0;
  memcpy(&cctxParams,originalCctxParams,0xb0);
  enableDedicatedDictSearch = cctxParams.enableDedicatedDictSearch;
  if ((customMem.customFree == (ZSTD_freeFunction)0x0) ==
      (customMem.customAlloc == (ZSTD_allocFunction)0x0)) {
    if (cctxParams.enableDedicatedDictSearch == 0) {
      ZSTD_getCParamsFromCCtxParams
                (&cParams,&cctxParams,0xffffffffffffffff,dictSize,ZSTD_cpm_createCDict);
    }
    else {
      ZSTD_getCParams_internal(&cParams,cctxParams.compressionLevel,0,dictSize,ZSTD_cpm_createCDict)
      ;
      if (cParams.strategy - ZSTD_greedy < 3) {
        cParams.hashLog = cParams.hashLog + 2;
      }
      ZSTD_overrideCParams(&cParams,&cctxParams.cParams);
    }
    if ((2 < cParams.strategy - ZSTD_greedy) ||
       (cParams.hashLog <= cParams.chainLog || 0x18 < cParams.chainLog)) {
      cctxParams.enableDedicatedDictSearch = 0;
      ZSTD_getCParamsFromCCtxParams
                (&cParams,&cctxParams,0xffffffffffffffff,dictSize,ZSTD_cpm_createCDict);
      enableDedicatedDictSearch = 0;
    }
    cctxParams.cParams.hashLog = cParams.hashLog;
    useRowMatchFinder = cctxParams.useRowMatchFinder;
    if (cctxParams.useRowMatchFinder == ZSTD_urm_auto) {
      if (cParams.strategy - ZSTD_btlazy2 < 0xfffffffd) {
        useRowMatchFinder = ZSTD_urm_disableRowMatchFinder;
      }
      else {
        useRowMatchFinder = ZSTD_urm_enableRowMatchFinder - (cParams.windowLog < 0xf);
      }
    }
    cctxParams.useRowMatchFinder = useRowMatchFinder;
    if ((customMem.customFree == (ZSTD_freeFunction)0x0) ==
        (customMem.customAlloc == (ZSTD_allocFunction)0x0)) {
      sVar2 = ZSTD_sizeof_matchState(&cParams,useRowMatchFinder,enableDedicatedDictSearch,0);
      lVar3 = (dictSize + 7 & 0xfffffffffffffff8) + 0x2c90;
      if (dictLoadMethod == ZSTD_dlm_byRef) {
        lVar3 = 0x2c90;
      }
      p_Var7 = customMem.customAlloc;
      p_Var8 = customMem.customFree;
      pvVar9 = customMem.opaque;
      start = ZSTD_customMalloc(lVar3 + sVar2,customMem);
      if (start == (void *)0x0) {
        cdict = (ZSTD_CDict *)0x0;
        ZSTD_customFree((void *)0x0,customMem);
      }
      else {
        ZSTD_cwksp_init(&local_70,start,lVar3 + sVar2,ZSTD_cwksp_dynamic_alloc);
        cdict = (ZSTD_CDict *)local_70.objectEnd;
        local_70.objectEnd = (void *)((long)local_70.objectEnd + 0x1390);
        local_70.tableEnd = local_70.objectEnd;
        local_70.tableValidEnd = local_70.objectEnd;
        ((ZSTD_cwksp *)((long)cdict + 0x20))->workspace = local_70.workspace;
        ((ZSTD_cwksp *)((long)cdict + 0x20))->workspaceEnd = local_70.workspaceEnd;
        pZVar1 = (ZSTD_cwksp *)((long)cdict + 0x20);
        pZVar1->allocFailed = local_70.allocFailed;
        *(undefined3 *)&pZVar1->field_0x31 = local_70._49_3_;
        pZVar1->workspaceOversizedDuration = local_70.workspaceOversizedDuration;
        ((ZSTD_cwksp *)((long)cdict + 0x20))->phase = local_70.phase;
        ((ZSTD_cwksp *)((long)cdict + 0x20))->isStatic = local_70.isStatic;
        ((ZSTD_cwksp *)((long)cdict + 0x20))->objectEnd = local_70.objectEnd;
        ((ZSTD_cwksp *)((long)cdict + 0x20))->tableEnd = local_70.objectEnd;
        ((ZSTD_cwksp *)((long)cdict + 0x20))->tableValidEnd = local_70.objectEnd;
        ((ZSTD_cwksp *)((long)cdict + 0x20))->allocStart = local_70.allocStart;
        ((ZSTD_customMem *)((long)cdict + 0x1368))->customAlloc = customMem.customAlloc;
        ((ZSTD_customMem *)((long)cdict + 0x1368))->customFree = customMem.customFree;
        ((ZSTD_customMem *)((long)cdict + 0x1368))->opaque = customMem.opaque;
        *(int *)((long)cdict + 0x1384) = 0;
        *(ZSTD_useRowMatchFinderMode_e *)((long)cdict + 5000) = useRowMatchFinder;
        customMem.customAlloc = p_Var7;
        customMem.customFree = p_Var8;
        customMem.opaque = pvVar9;
      }
    }
    else {
      cdict = (ZSTD_CDict *)0x0;
      customMem.customAlloc = in_stack_fffffffffffffde8;
      customMem.customFree = in_stack_fffffffffffffdf0;
      customMem.opaque = in_stack_fffffffffffffdf8;
    }
    pZVar4 = &cctxParams;
    puVar5 = (undefined8 *)&stack0xfffffffffffffde8;
    for (lVar3 = 0x16; lVar3 != 0; lVar3 = lVar3 + -1) {
      *puVar5 = *(undefined8 *)pZVar4;
      pZVar4 = (ZSTD_CCtx_params *)((long)pZVar4 + (ulong)bVar6 * -0x10 + 8);
      puVar5 = puVar5 + (ulong)bVar6 * -2 + 1;
    }
    params.cParams._4_8_ = customMem.customFree;
    params._0_8_ = customMem.customAlloc;
    params.cParams._12_8_ = customMem.opaque;
    auVar10 = in_stack_fffffffffffffe00._8_12_;
    auVar11 = in_stack_fffffffffffffe00._72_24_;
    auVar12 = in_stack_fffffffffffffe00._128_24_;
    params.cParams.targetLength = in_stack_fffffffffffffe00._0_4_;
    params.cParams.strategy = in_stack_fffffffffffffe00._4_4_;
    params.fParams.contentSizeFlag = auVar10._0_4_;
    params.fParams.checksumFlag = auVar10._4_4_;
    params.fParams.noDictIDFlag = auVar10._8_4_;
    params.compressionLevel = in_stack_fffffffffffffe00._20_4_;
    params.forceWindow = in_stack_fffffffffffffe00._24_4_;
    params._52_4_ = in_stack_fffffffffffffe00._28_4_;
    params.targetCBlockSize = in_stack_fffffffffffffe00._32_8_;
    params.srcSizeHint = in_stack_fffffffffffffe00._40_4_;
    params.attachDictPref = in_stack_fffffffffffffe00._44_4_;
    params.literalCompressionMode = in_stack_fffffffffffffe00._48_4_;
    params.nbWorkers = in_stack_fffffffffffffe00._52_4_;
    params.jobSize = in_stack_fffffffffffffe00._56_8_;
    params.overlapLog = in_stack_fffffffffffffe00._64_4_;
    params.rsyncable = in_stack_fffffffffffffe00._68_4_;
    params.ldmParams.enableLdm = auVar11._0_4_;
    params.ldmParams.hashLog = auVar11._4_4_;
    params.ldmParams.bucketSizeLog = auVar11._8_4_;
    params.ldmParams.minMatchLength = auVar11._12_4_;
    params.ldmParams.hashRateLog = auVar11._16_4_;
    params.ldmParams.windowLog = auVar11._20_4_;
    params.enableDedicatedDictSearch = in_stack_fffffffffffffe00._96_4_;
    params.inBufferMode = in_stack_fffffffffffffe00._100_4_;
    params.outBufferMode = in_stack_fffffffffffffe00._104_4_;
    params.blockDelimiters = in_stack_fffffffffffffe00._108_4_;
    params.validateSequences = in_stack_fffffffffffffe00._112_4_;
    params.splitBlocks = in_stack_fffffffffffffe00._116_4_;
    params.useRowMatchFinder = in_stack_fffffffffffffe00._120_4_;
    params.deterministicRefPrefix = in_stack_fffffffffffffe00._124_4_;
    params.customMem.customAlloc = (ZSTD_allocFunction)auVar12._0_8_;
    params.customMem.customFree = (ZSTD_freeFunction)auVar12._8_8_;
    params.customMem.opaque = (void *)auVar12._16_8_;
    sVar2 = ZSTD_initCDict_internal(cdict,dict,dictSize,dictLoadMethod,dictContentType,params);
    if (sVar2 < 0xffffffffffffff89) {
      return cdict;
    }
    ZSTD_freeCDict(cdict);
  }
  return (ZSTD_CDict *)0x0;
}

Assistant:

ZSTDLIB_API ZSTD_CDict* ZSTD_createCDict_advanced2(
        const void* dict, size_t dictSize,
        ZSTD_dictLoadMethod_e dictLoadMethod,
        ZSTD_dictContentType_e dictContentType,
        const ZSTD_CCtx_params* originalCctxParams,
        ZSTD_customMem customMem)
{
    ZSTD_CCtx_params cctxParams = *originalCctxParams;
    ZSTD_compressionParameters cParams;
    ZSTD_CDict* cdict;

    DEBUGLOG(3, "ZSTD_createCDict_advanced2, mode %u", (unsigned)dictContentType);
    if (!customMem.customAlloc ^ !customMem.customFree) return NULL;

    if (cctxParams.enableDedicatedDictSearch) {
        cParams = ZSTD_dedicatedDictSearch_getCParams(
            cctxParams.compressionLevel, dictSize);
        ZSTD_overrideCParams(&cParams, &cctxParams.cParams);
    } else {
        cParams = ZSTD_getCParamsFromCCtxParams(
            &cctxParams, ZSTD_CONTENTSIZE_UNKNOWN, dictSize, ZSTD_cpm_createCDict);
    }

    if (!ZSTD_dedicatedDictSearch_isSupported(&cParams)) {
        /* Fall back to non-DDSS params */
        cctxParams.enableDedicatedDictSearch = 0;
        cParams = ZSTD_getCParamsFromCCtxParams(
            &cctxParams, ZSTD_CONTENTSIZE_UNKNOWN, dictSize, ZSTD_cpm_createCDict);
    }

    DEBUGLOG(3, "ZSTD_createCDict_advanced2: DDS: %u", cctxParams.enableDedicatedDictSearch);
    cctxParams.cParams = cParams;
    cctxParams.useRowMatchFinder = ZSTD_resolveRowMatchFinderMode(cctxParams.useRowMatchFinder, &cParams);

    cdict = ZSTD_createCDict_advanced_internal(dictSize,
                        dictLoadMethod, cctxParams.cParams,
                        cctxParams.useRowMatchFinder, cctxParams.enableDedicatedDictSearch,
                        customMem);

    if (ZSTD_isError( ZSTD_initCDict_internal(cdict,
                                    dict, dictSize,
                                    dictLoadMethod, dictContentType,
                                    cctxParams) )) {
        ZSTD_freeCDict(cdict);
        return NULL;
    }

    return cdict;
}